

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall
r_exec::_GMonitor::store_simulated_outcome
          (_GMonitor *this,Goal *affected_goal,Sim *sim,bool success)

{
  pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_> local_78;
  pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_> local_68;
  pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_> local_58 [2];
  pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_> local_38;
  undefined1 local_21;
  Sim *pSStack_20;
  bool success_local;
  Sim *sim_local;
  Goal *affected_goal_local;
  _GMonitor *this_local;
  
  local_21 = success;
  pSStack_20 = sim;
  sim_local = (Sim *)affected_goal;
  affected_goal_local = (Goal *)this;
  if (success) {
    if (sim->mode == SIM_OPTIONAL) {
      std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::
      pair<r_exec::Goal_*&,_r_exec::Sim_*&,_true>
                (local_58,(Goal **)&sim_local,&stack0xffffffffffffffe0);
      std::__cxx11::
      list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
      ::push_back(&(this->sim_successes).mandatory_solutions,local_58);
      std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::~pair(local_58);
    }
    else if (sim->mode == SIM_MANDATORY) {
      std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::
      pair<r_exec::Goal_*&,_r_exec::Sim_*&,_true>
                (&local_38,(Goal **)&sim_local,&stack0xffffffffffffffe0);
      std::__cxx11::
      list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
      ::push_back(&(this->sim_successes).mandatory_solutions,&local_38);
      std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::~pair(&local_38);
    }
  }
  else if (sim->mode == SIM_OPTIONAL) {
    std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::
    pair<r_exec::Goal_*&,_r_exec::Sim_*&,_true>
              (&local_78,(Goal **)&sim_local,&stack0xffffffffffffffe0);
    std::__cxx11::
    list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
    ::push_back(&(this->sim_failures).optional_solutions,&local_78);
    std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::~pair(&local_78);
  }
  else if (sim->mode == SIM_MANDATORY) {
    std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::
    pair<r_exec::Goal_*&,_r_exec::Sim_*&,_true>
              (&local_68,(Goal **)&sim_local,&stack0xffffffffffffffe0);
    std::__cxx11::
    list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
    ::push_back(&(this->sim_failures).optional_solutions,&local_68);
    std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>::~pair(&local_68);
  }
  return;
}

Assistant:

void _GMonitor::store_simulated_outcome(Goal *affected_goal, Sim *sim, bool success)   // outcome is f0 as in f0->pred->f1->success.
{
    if (success) {
        switch (sim->mode) {
        case SIM_MANDATORY:
            sim_successes.mandatory_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        case SIM_OPTIONAL:
            sim_successes.mandatory_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        default:
            break;
        }
    } else {
        switch (sim->mode) {
        case SIM_MANDATORY:
            sim_failures.optional_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        case SIM_OPTIONAL:
            sim_failures.optional_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        default:
            break;
        }
    }
}